

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeRangeTestCase.cpp
# Opt level: O3

void __thiscall
SuiteTimeRangeTests::TestisInSameRange_UseLocalTime::RunImpl(TestisInSameRange_UseLocalTime *this)

{
  TestResults *this_00;
  bool bVar1;
  TestResults **ppTVar2;
  TestDetails **ppTVar3;
  LocalTimeOnly end;
  LocalTimeOnly start;
  TimeRange timeRange;
  TestDetails TStack_d8;
  UtcTimeStamp local_b8;
  UtcTimeStamp local_a0;
  LocalTimeOnly local_88;
  LocalTimeOnly local_70;
  TimeRange local_58 [64];
  
  local_70.super_DateTime.m_date = 0;
  local_70.super_DateTime._vptr_DateTime = (_func_int **)&PTR__DateTime_0032cb10;
  local_70.super_DateTime.m_time = 0;
  local_88.super_DateTime.m_date = 0;
  local_88.super_DateTime._vptr_DateTime = (_func_int **)&PTR__DateTime_0032cb10;
  local_88.super_DateTime.m_time = 3600000000000;
  local_a0.super_DateTime.m_date = 0x256974;
  local_a0.super_DateTime.m_time = 36000000000000;
  local_a0.super_DateTime._vptr_DateTime = (_func_int **)&PTR__DateTime_00324850;
  local_b8.super_DateTime.m_date = 0x256974;
  local_b8.super_DateTime.m_time = 39600000000000;
  local_b8.super_DateTime._vptr_DateTime = (_func_int **)&PTR__DateTime_00324850;
  FIX::TimeRange::TimeRange(local_58,&local_70,&local_88,1,1);
  bVar1 = FIX::TimeRange::isInSameRange(local_58,&local_a0,&local_b8);
  if (!bVar1) {
    ppTVar2 = UnitTest::CurrentTest::Results();
    this_00 = *ppTVar2;
    ppTVar3 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&TStack_d8,*ppTVar3,0x104);
    UnitTest::TestResults::OnTestFailure(this_00,&TStack_d8,"timeRange.isInSameRange(time1, time2)")
    ;
  }
  return;
}

Assistant:

TEST(isInSameRange_UseLocalTime)
{
  LocalTimeOnly start( 0, 0, 0 );
  LocalTimeOnly end( 1, 0, 0 );

  UtcTimeStamp time1 = UtcTimeStamp( 10, 0, 0, 10, 10, 2000 );
  UtcTimeStamp time2 = UtcTimeStamp( 11, 0, 0, 10, 10, 2000 );
  TimeRange timeRange(start, end, 1, 1);

  CHECK( timeRange.isInSameRange(time1, time2) );

}